

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Query * q_and(Query *__return_storage_ptr__,vector<Query,_std::allocator<Query>_> *queries)

{
  QueryType local_c;
  
  local_c = AND;
  Query::Query(__return_storage_ptr__,&local_c,queries);
  return __return_storage_ptr__;
}

Assistant:

Query q_and(std::vector<Query> &&queries) {
    return Query(QueryType::AND, std::move(queries));
}